

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

void emit_buffered_bits(phuff_entropy_ptr entropy,char *bufstart,uint nbits)

{
  int in_EDX;
  long in_RDI;
  undefined4 unaff_retaddr;
  undefined4 local_14;
  
  local_14 = in_EDX;
  if (*(int *)(in_RDI + 0x28) == 0) {
    for (; local_14 != 0; local_14 = local_14 + -1) {
      emit_bits((phuff_entropy_ptr)CONCAT44(nbits,unaff_retaddr),(uint)((ulong)in_RDI >> 0x20),
                (int)in_RDI);
    }
  }
  return;
}

Assistant:

LOCAL(void)
emit_buffered_bits(phuff_entropy_ptr entropy, char *bufstart,
                   unsigned int nbits)
{
  if (entropy->gather_statistics)
    return;                     /* no real work */

  while (nbits > 0) {
    emit_bits(entropy, (unsigned int)(*bufstart), 1);
    bufstart++;
    nbits--;
  }
}